

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_decode.c
# Opt level: O0

WORD32 ihevcd_decode(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  long lVar1;
  WORD32 WVar2;
  IHEVCD_ERROR_T IVar3;
  void *pvVar4;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  UWORD8 *unaff_retaddr;
  UWORD8 *in_stack_00000008;
  UWORD8 *in_stack_00000010;
  process_ctxt_t *in_stack_00000018;
  codec_t *in_stack_00000020;
  WORD32 ypos_1;
  WORD32 xpos_1;
  process_ctxt_t *ps_proc_3;
  WORD32 num_rows;
  sps_t *ps_sps_1;
  process_ctxt_t *ps_proc_2;
  proc_job_t s_job_1;
  IHEVCD_ERROR_T ret_3;
  IHEVCD_ERROR_T ret_2;
  proc_job_t s_job;
  process_ctxt_t *ps_proc_1;
  sps_t *ps_sps;
  WORD32 i_1;
  WORD32 ret_1;
  slice_header_t *ps_slice_hdr_next_1;
  WORD32 bytes_remaining;
  WORD32 next_slice_addr;
  slice_header_t *ps_slice_hdr_next;
  WORD32 bits_len;
  WORD32 nal_ofst;
  WORD32 nal_len;
  WORD32 buf_status;
  WORD32 ypos;
  WORD32 xpos;
  process_ctxt_t *ps_proc;
  UWORD32 i;
  UWORD32 u4_size;
  WORD32 prev_proc_idx;
  WORD32 proc_idx;
  ivd_video_decode_op_t *ps_dec_op;
  ivd_video_decode_ip_t *ps_dec_ip;
  codec_t *ps_codec;
  WORD32 ret;
  process_ctxt_t *in_stack_00000170;
  int in_stack_fffffffffffffee8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  void *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  ivd_video_decode_ip_t *in_stack_ffffffffffffff28;
  codec_t *in_stack_ffffffffffffff30;
  int local_c8;
  short local_c4;
  short local_c2;
  short local_c0;
  short local_be;
  int local_90;
  long in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  codec_t *in_stack_ffffffffffffff88;
  UWORD32 local_70;
  WORD32 local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  uint local_50;
  undefined4 local_4c;
  int local_48;
  int local_44;
  undefined4 *local_40;
  long local_38;
  long local_30;
  IHEVCD_ERROR_T local_24;
  WORD32 in_stack_fffffffffffffffc;
  
  local_24 = 0;
  local_30 = *(long *)(in_RDI + 0x10);
  local_44 = 0;
  local_48 = 0;
  *(undefined4 *)(local_30 + 0x90) = 0;
  local_4c = *in_RDX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  memset(in_RDX,0,0x88);
  WVar2 = (WORD32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  *local_40 = local_4c;
  if (*(int *)(local_30 + 0x78) != 1) {
    local_40[1] = local_40[1] | 0x4000;
    local_40[1] = local_40[1] | 0xd0;
    return 1;
  }
  if (0x7ffffffe < *(uint *)(local_30 + 0x88)) {
    local_40[1] = local_40[1] | 0x4000;
    local_40[1] = local_40[1] | 0x3de;
    return 1;
  }
  if (*(int *)(local_30 + 0x84) != 0) {
    *(undefined4 *)(local_30 + 100) = 1;
  }
  if (*(int *)(local_30 + 100) == 0) {
    if (*(long *)(local_38 + 0x10) == 0) {
      local_40[1] = local_40[1] | 0x2000;
      local_40[1] = local_40[1] | 0x1e;
      return 1;
    }
    if (*(uint *)(local_38 + 0xc) < 5) {
      if (*(int *)(local_38 + 0xc) < 1) {
        local_40[2] = 0;
      }
      else {
        local_40[2] = *(undefined4 *)(local_38 + 0xc);
      }
      local_40[1] = local_40[1] | 0x2000;
      local_40[1] = local_40[1] | 0x27;
      return 1;
    }
  }
  if ((*(int *)(local_30 + 0x38) == 0) && (*(int *)(local_30 + 0x68) == 0)) {
    if (*(int *)(local_38 + 0x18) == 0) {
      local_40[1] = local_40[1] | 0x2000;
      local_40[1] = local_40[1] | 0x1b;
      return 1;
    }
    for (local_50 = 0; local_50 < *(uint *)(local_38 + 0x18); local_50 = local_50 + 1) {
      if (*(long *)(local_38 + 0x20 + (ulong)local_50 * 8) == 0) {
        local_40[1] = local_40[1] | 0x2000;
        local_40[1] = local_40[1] | 0x1c;
        return 1;
      }
      if (*(int *)(local_38 + 0x220 + (ulong)local_50 * 4) == 0) {
        local_40[1] = local_40[1] | 0x2000;
        local_40[1] = local_40[1] | 0x1d;
        return 1;
      }
    }
  }
  *(long *)(local_30 + 0x3f20) = local_38 + 0x18;
  *(undefined4 *)(local_30 + 400) = *(undefined4 *)(local_38 + 8);
  if (*(int *)(local_30 + 100) != 0) {
    local_40[3] = *(undefined4 *)(local_30 + 8);
    local_40[4] = *(undefined4 *)(local_30 + 0xc);
    local_40[7] = 0;
    pvVar4 = ihevc_disp_mgr_get(*(disp_mgr_t **)(local_30 + 0x160),(WORD32 *)(local_30 + 0x168));
    *(void **)(local_30 + 0x170) = pvVar4;
    if ((*(long *)(local_30 + 0x170) != 0) &&
       ((*(int *)(local_30 + 0x38) == 0 || (*(int *)(local_30 + 0x3c) == 1)))) {
      local_58 = local_30 + 0x19a0 + (long)local_48 * 0x4a0;
      if (*(int *)(local_58 + 0x1c8) == 0) {
        ihevcd_init_proc_ctxt
                  ((process_ctxt_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   WVar2);
      }
      uVar5 = *(undefined4 *)(local_30 + 0xc);
      local_24 = ihevcd_fmt_conv(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                 in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,ret_3);
      ihevc_buf_mgr_release((buf_mgr_t *)CONCAT44(in_stack_fffffffffffffeec,uVar5),0,0x113bb9);
    }
    ihevcd_fill_outargs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        (ivd_video_decode_op_t *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (local_40[8] == 1) {
      local_5c = *(int *)(local_30 + 8) + -0x7a;
      local_60 = *(int *)(local_30 + 0xc) + -0x44;
      if (local_60 < 0) {
        local_60 = 0;
      }
      if (local_5c < 0) {
        local_5c = 0;
      }
    }
    if (*(long *)(local_30 + 0x170) == 0) {
      if (*(int *)(local_30 + 0x84) != 0) {
        ihevcd_init((codec_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      return 1;
    }
    return 0;
  }
  if ((*(int *)(local_30 + 0x68) == 0) && (*(int *)(local_30 + 0x38) == 1)) {
    local_64 = 1;
    if (*(long *)(local_30 + 0x138) != 0) {
      local_64 = ihevc_buf_mgr_check_free
                           ((buf_mgr_t *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    if (local_64 == 0) {
      local_40[1] = 0x28;
      local_40[1] = local_40[1] | 0x2000;
      return 1;
    }
  }
  *(undefined4 *)(local_30 + 0xac) = *(undefined4 *)(local_38 + 0xc);
  *(undefined8 *)(local_30 + 0x98) = *(undefined8 *)(local_38 + 0x10);
  *(undefined4 *)(local_30 + 0x4f8) = 0;
  *(undefined4 *)(local_30 + 0x54) = 0;
  *(undefined4 *)(local_30 + 0x80) = 0;
  *(undefined8 *)(local_30 + 0x170) = 0;
  if (1 < *(int *)(local_30 + 0x18)) {
    ithread_set_affinity(0);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        if (*(int *)(local_30 + 0xac) < 5) goto LAB_00114418;
        if (*(int *)(local_30 + 0x80) != 0) {
          in_stack_ffffffffffffff88 =
               (codec_t *)
               (*(long *)(local_30 + 0x398) +
               (long)(int)(*(uint *)(local_30 + 0x1e8) & 0xff) * 0x688);
          in_stack_ffffffffffffff84 =
               (int)*(short *)((long)&(in_stack_ffffffffffffff88->s_parse).
                                      pu1_luma_intra_pred_mode_top + 4) +
               (int)*(short *)((long)&(in_stack_ffffffffffffff88->s_parse).
                                      pu1_luma_intra_pred_mode_top + 6) *
               (int)*(short *)(*(long *)(local_30 + 0x200) + 0xdc2);
          if (*(int *)(local_30 + 0x4fc) == in_stack_ffffffffffffff84) {
            *(undefined4 *)(local_30 + 0x80) = 0;
          }
        }
        if (*(long *)(local_30 + 0xc0) == 0) {
          *(undefined8 *)(local_30 + 0xb0) = *(undefined8 *)(local_30 + 0xb8);
          *(undefined4 *)(local_30 + 200) = *(undefined4 *)(local_30 + 0xcc);
        }
        else {
          *(undefined8 *)(local_30 + 0xb0) = *(undefined8 *)(local_30 + 0xc0);
          *(undefined4 *)(local_30 + 200) = *(undefined4 *)(local_30 + 0xd0);
        }
        local_6c = ihevcd_nal_search_start_code
                             (*(UWORD8 **)(local_30 + 0x98),*(WORD32 *)(local_30 + 0xac));
        *(WORD32 *)(local_30 + 0xa0) = local_6c;
        in_stack_ffffffffffffff0c = *(int *)(local_30 + 0xac) - local_6c;
        if (*(uint *)(local_30 + 200) <= in_stack_ffffffffffffff0c) {
          in_stack_ffffffffffffff0c = *(uint *)(local_30 + 200);
        }
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff0c;
        ihevcd_nal_remv_emuln_bytes
                  ((UWORD8 *)(*(long *)(local_30 + 0x98) + (long)local_6c),
                   *(UWORD8 **)(local_30 + 0xb0),in_stack_ffffffffffffff0c,&local_68,
                   (WORD32 *)&local_70);
        if ((int)local_70 < *(int *)(local_30 + 200) + -8) {
          memset((void *)(*(long *)(local_30 + 0xb0) + (long)(int)local_70),0,8);
        }
        *(UWORD32 *)(local_30 + 0xa8) = local_68 - local_70;
        *(int *)(local_30 + 0xa4) = local_68;
        ihevcd_bits_init((bitstrm_t *)(local_30 + 0x218),*(UWORD8 **)(local_30 + 0xb0),local_70);
        local_24 = ihevcd_nal_unit((codec_t *)
                                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        if (((*(int *)(local_30 + 0x54) == 0) ||
            (*(int *)(local_30 + 0x4fc) == *(int *)(*(long *)(local_30 + 0x200) + 0xdcc))) ||
           ((4 < *(int *)(local_30 + 0xac) - (local_68 + local_6c) &&
            (*(int *)(local_30 + 0x6c) == 0)))) break;
        *(int *)(local_30 + 0x1e8) = *(int *)(local_30 + 0x1e8) + -1;
        if (*(int *)(local_30 + 0x1e8) < 0) {
          *(undefined4 *)(local_30 + 0x1e8) = 0;
        }
        in_stack_ffffffffffffff78 =
             *(long *)(local_30 + 0x398) +
             (long)(int)(*(int *)(local_30 + 0x1e8) + 1U & 0xff) * 0x688;
        *(undefined2 *)(in_stack_ffffffffffffff78 + 0x374) = 0;
        *(undefined2 *)(in_stack_ffffffffffffff78 + 0x376) =
             *(undefined2 *)(*(long *)(local_30 + 0x200) + 0xdc4);
        *(undefined4 *)(local_30 + 0x80) = 1;
      }
      if (local_24 != IHEVCD_IGNORE_SLICE) break;
      if (*(int *)(local_30 + 0x1e8) + -1 < 0) {
        in_stack_ffffffffffffff08 = 0;
      }
      else {
        in_stack_ffffffffffffff08 = *(int *)(local_30 + 0x1e8) + -1;
      }
      *(int *)(local_30 + 0x1e8) = in_stack_ffffffffffffff08;
      *(long *)(local_30 + 0x98) = *(long *)(local_30 + 0x98) + (long)(local_6c + local_68);
      *(int *)(local_30 + 0xac) = *(int *)(local_30 + 0xac) - (local_6c + local_68);
    }
    if ((local_24 == 0x2a) || (local_24 == 0x11)) break;
    if (local_24 == IHEVCD_SLICE_IN_HEADER_MODE) {
      local_24 = 0;
      break;
    }
    if ((*(int *)(local_30 + 0x80) == 0) || (*(int *)(local_30 + 0xac) - (local_68 + local_6c) < 5))
    {
      *(long *)(local_30 + 0x98) = *(long *)(local_30 + 0x98) + (long)(local_6c + local_68);
      *(int *)(local_30 + 0xac) = *(int *)(local_30 + 0xac) - (local_6c + local_68);
    }
    if ((local_24 != 0) || (*(int *)(local_30 + 0x4f8) != 0)) break;
    if (((*(int *)(local_30 + 0x3f68) == 0) && (*(int *)(local_30 + 0x70) != 0)) &&
       (WVar2 = ihevcd_allocate_dynamic_bufs(in_stack_ffffffffffffff88), WVar2 != 0)) {
      ihevcd_free_dynamic_bufs((codec_t *)0x1143ca);
      *(undefined4 *)(local_30 + 0x90) = 0x2b;
      local_40[1] = local_40[1] | 0x4000;
      local_40[1] = local_40[1] | 0x2b;
      return 1;
    }
  }
LAB_00114418:
  if ((*(int *)(local_30 + 0x88) == 0) && (local_24 != 0)) {
    *(IHEVCD_ERROR_T *)(local_30 + 0x90) = local_24;
    ihevcd_fill_outargs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        (ivd_video_decode_op_t *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    return 1;
  }
  if (*(int *)(local_30 + 0x54) == 1) {
    lVar1 = *(long *)(local_30 + 0x200);
    *(undefined4 *)(local_30 + 0x7c) = 1;
    if ((*(int *)(local_30 + 0x18) < 2) || (*(int *)(local_30 + 0x4f8) == 0)) {
      if ((*(long *)(local_30 + 0x170) != 0) &&
         (((*(int *)(local_30 + 0x38) == 0 || (*(int *)(local_30 + 0x3c) == 1)) &&
          (*(int *)(local_30 + 0x4f8) != 0)))) {
        *(int *)(local_30 + 0x3f1c) = *(int *)(local_30 + 0xc) - *(int *)(local_30 + 0x3f18);
        if (*(int *)(local_30 + (long)local_44 * 0x4a0 + 0x1b68) == 0) {
          ihevcd_init_proc_ctxt
                    ((process_ctxt_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                     ,(WORD32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        }
        if (*(int *)(local_30 + 0x3f1c) < 0) {
          *(undefined4 *)(local_30 + 0x3f1c) = 0;
        }
        in_stack_fffffffffffffee8 = *(int *)(local_30 + 0x3f1c);
        local_24 = ihevcd_fmt_conv(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                   in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,ret_3);
        *(int *)(local_30 + 0x3f18) = *(int *)(local_30 + 0x3f1c) + *(int *)(local_30 + 0x3f18);
      }
    }
    else {
      if (((*(long *)(local_30 + 0x170) != 0) &&
          ((*(int *)(local_30 + 0x38) == 0 || (*(int *)(local_30 + 0x3c) == 1)))) &&
         ((*(int *)(local_30 + 0x3f38) == 0 ||
          (*(int *)(local_30 + 0x168) ==
           *(int *)(local_30 + (long)(*(int *)(local_30 + 0x18) + -1) * 0x4a0 + 0x1b18))))) {
        for (local_90 = 0; local_90 < *(short *)(lVar1 + 0xdc4); local_90 = local_90 + 1) {
          IVar3 = ihevcd_jobq_queue((jobq_t *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    (void *)CONCAT44(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00),
                                    (WORD32)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                    (WORD32)in_stack_fffffffffffffef8);
          if (IVar3 != 0) {
            return IVar3;
          }
        }
      }
      local_24 = ihevcd_jobq_terminate
                           ((jobq_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
      ;
      while( true ) {
        in_stack_ffffffffffffff30 =
             (codec_t *)(local_30 + 0x19a0 + (long)(*(int *)(local_30 + 0x18) + -1) * 0x4a0);
        IVar3 = ihevcd_jobq_dequeue((jobq_t *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    (void *)CONCAT44(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00),
                                    (WORD32)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                    (WORD32)in_stack_fffffffffffffef8);
        if (IVar3 != 0) break;
        *(int *)&in_stack_ffffffffffffff30->pu1_parse_map = (int)local_c0;
        in_stack_ffffffffffffff30->i4_disp_wd = (int)local_c4;
        in_stack_ffffffffffffff30->i4_disp_ht = (int)local_c2;
        in_stack_ffffffffffffff30->i4_nondegrade_interval = (int)local_be;
        WVar2 = (WORD32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (local_c8 == 0) {
          ihevcd_init_proc_ctxt
                    ((process_ctxt_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                     ,WVar2);
          ihevcd_process(in_stack_00000170);
        }
        else if (local_c8 == 1) {
          in_stack_ffffffffffffff28 = *(ivd_video_decode_ip_t **)(local_30 + 0x200);
          in_stack_ffffffffffffff00 =
               1 << (*(byte *)(in_stack_ffffffffffffff28[4].s_out_buffer.pu1_bufs + 0x24) & 0x1f);
          if ((in_stack_ffffffffffffff30->s_parse).i4_ctb_x == 0) {
            ihevcd_init_proc_ctxt
                      ((process_ctxt_t *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),WVar2);
          }
          in_stack_ffffffffffffff04 = *(int *)(local_30 + 0xc);
          if (in_stack_ffffffffffffff04 -
              ((int)local_c2 <<
              (*(byte *)(in_stack_ffffffffffffff28[4].s_out_buffer.pu1_bufs + 0x24) & 0x1f)) <=
              in_stack_ffffffffffffff00) {
            in_stack_ffffffffffffff00 =
                 *(int *)(local_30 + 0xc) -
                 ((int)local_c2 <<
                 (*(byte *)(in_stack_ffffffffffffff28[4].s_out_buffer.pu1_bufs + 0x24) & 0x1f));
          }
          in_stack_fffffffffffffee8 = in_stack_ffffffffffffff00;
          if (in_stack_ffffffffffffff00 < 0) {
            in_stack_fffffffffffffee8 = 0;
          }
          in_stack_fffffffffffffef8 = *(undefined8 *)(local_38 + 0x28);
          in_stack_ffffffffffffff24 = in_stack_fffffffffffffee8;
          ihevcd_fmt_conv(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr,in_stack_fffffffffffffffc,ret_3);
        }
      }
    }
    ihevc_buf_mgr_set_status
              ((buf_mgr_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0,0x1149ca
              );
    ihevc_buf_mgr_set_status
              ((buf_mgr_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0,0x114a09
              );
    ihevc_buf_mgr_set_status
              ((buf_mgr_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0,0x114a48
              );
    ihevc_dpb_mgr_insert_ref
              (*(dpb_mgr_t **)(local_30 + 0x178),
               *(pic_buf_t **)(local_30 + (long)local_44 * 0x4a0 + 0x1b10),
               *(WORD32 *)(local_30 + (long)local_44 * 0x4a0 + 0x1b18));
    if ((*(int *)(local_30 + 0x38) == 0) && (*(long *)(local_30 + 0x170) != 0)) {
      ihevc_buf_mgr_release
                ((buf_mgr_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0,
                 0x114af1);
    }
    for (local_90 = 0; local_90 < *(int *)(local_30 + 0x18) + -1; local_90 = local_90 + 1) {
      if (*(int *)(local_30 + 0x3ee0 + (long)local_90 * 4) != 0) {
        ithread_join(in_stack_fffffffffffffef0,
                     (void **)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *(undefined4 *)(local_30 + 0x3ee0 + (long)local_90 * 4) = 0;
      }
    }
    *(int *)(local_30 + 0x88) = *(int *)(local_30 + 0x88) + 1;
  }
  ihevcd_fill_outargs(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (ivd_video_decode_op_t *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  return local_24;
}

Assistant:

WORD32 ihevcd_decode(iv_obj_t *ps_codec_obj, void *pv_api_ip, void *pv_api_op)
{
    WORD32 ret = IV_SUCCESS;
    codec_t *ps_codec = (codec_t *)(ps_codec_obj->pv_codec_handle);
    ivd_video_decode_ip_t *ps_dec_ip;
    ivd_video_decode_op_t *ps_dec_op;

    WORD32 proc_idx = 0;
    WORD32 prev_proc_idx = 0;

    /* Initialize error code */
    ps_codec->i4_error_code = 0;

    ps_dec_ip = (ivd_video_decode_ip_t *)pv_api_ip;
    ps_dec_op = (ivd_video_decode_op_t *)pv_api_op;

    {
        UWORD32 u4_size = ps_dec_op->u4_size;
        memset(ps_dec_op, 0, sizeof(ivd_video_decode_op_t));
        ps_dec_op->u4_size = u4_size; //Restore size field
    }
    if(ps_codec->i4_init_done != 1)
    {
        ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_dec_op->u4_error_code |= IHEVCD_INIT_NOT_DONE;
        return IV_FAIL;
    }

    if(ps_codec->u4_pic_cnt >= NUM_FRAMES_LIMIT)
    {
        ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_dec_op->u4_error_code |= IHEVCD_NUM_FRAMES_LIMIT_REACHED;
        return IV_FAIL;
    }

    /* If reset flag is set, flush the existing buffers */
    if(ps_codec->i4_reset_flag)
    {
        ps_codec->i4_flush_mode = 1;
    }

    /*Data memory barries instruction,so that bitstream write by the application is complete*/
    //arm_dsb();
    /* In case the decoder is not in flush mode check for input buffer validity */
    if(0 == ps_codec->i4_flush_mode)
    {
        if(ps_dec_ip->pv_stream_buffer == NULL)
        {
            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DEC_FRM_BS_BUF_NULL;
            return IV_FAIL;
        }
        if(ps_dec_ip->u4_num_Bytes <= MIN_START_CODE_LEN)
        {
            if((WORD32)ps_dec_ip->u4_num_Bytes > 0)
                ps_dec_op->u4_num_bytes_consumed = ps_dec_ip->u4_num_Bytes;
            else
                ps_dec_op->u4_num_bytes_consumed = 0;

            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DEC_NUMBYTES_INV;
            return IV_FAIL;

        }
    }

#ifdef APPLY_CONCEALMENT
    {
        WORD32 num_mbs;

        num_mbs = (ps_codec->i4_wd * ps_codec->i4_ht + 255) >> 8;
        /* Reset MB Count at the beginning of every process call */
        ps_codec->mb_count = 0;
        memset(ps_codec->mb_map, 0, ((num_mbs + 7) >> 3));
    }
#endif

    if(0 == ps_codec->i4_share_disp_buf && ps_codec->i4_header_mode == 0)
    {
        UWORD32 i;
        if(ps_dec_ip->s_out_buffer.u4_num_bufs == 0)
        {
            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DISP_FRM_ZERO_OP_BUFS;
            return IV_FAIL;
        }

        for(i = 0; i < ps_dec_ip->s_out_buffer.u4_num_bufs; i++)
        {
            if(ps_dec_ip->s_out_buffer.pu1_bufs[i] == NULL)
            {
                ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
                ps_dec_op->u4_error_code |= IVD_DISP_FRM_OP_BUF_NULL;
                return IV_FAIL;
            }

            if(ps_dec_ip->s_out_buffer.u4_min_out_buf_size[i] == 0)
            {
                ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
                ps_dec_op->u4_error_code |= IVD_DISP_FRM_ZERO_OP_BUF_SIZE;
                return IV_FAIL;
            }
        }
    }

    ps_codec->ps_out_buffer = &ps_dec_ip->s_out_buffer;
    ps_codec->u4_ts = ps_dec_ip->u4_ts;
    if(ps_codec->i4_flush_mode)
    {

        ps_dec_op->u4_pic_wd = ps_codec->i4_disp_wd;
        ps_dec_op->u4_pic_ht = ps_codec->i4_disp_ht;

        ps_dec_op->u4_new_seq = 0;

        ps_codec->ps_disp_buf = (pic_buf_t *)ihevc_disp_mgr_get(
                        (disp_mgr_t *)ps_codec->pv_disp_buf_mgr, &ps_codec->i4_disp_buf_id);
        /* In case of non-shared mode, then convert/copy the frame to output buffer */
        /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
        if((ps_codec->ps_disp_buf)
                        && ((0 == ps_codec->i4_share_disp_buf)
                                        || (IV_YUV_420P
                                                        == ps_codec->e_chroma_fmt)))
        {

            process_ctxt_t *ps_proc = &ps_codec->as_process[prev_proc_idx];
            if(0 == ps_proc->i4_init_done)
            {
                ihevcd_init_proc_ctxt(ps_proc, 0);
            }

            /* Set remaining number of rows to be processed */
            ret = ihevcd_fmt_conv(ps_codec, &ps_codec->as_process[prev_proc_idx],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[2], 0,
                                  ps_codec->i4_disp_ht);

            ihevc_buf_mgr_release((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                  ps_codec->i4_disp_buf_id, BUF_MGR_DISP);
        }

        ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);

        if(1 == ps_dec_op->u4_output_present)
        {
            WORD32 xpos = ps_codec->i4_disp_wd - 32 - LOGO_WD;
            WORD32 ypos = ps_codec->i4_disp_ht - 32 - LOGO_HT;

            if(ypos < 0)
                ypos = 0;

            if(xpos < 0)
                xpos = 0;

            INSERT_LOGO(ps_dec_ip->s_out_buffer.pu1_bufs[0],
                        ps_dec_ip->s_out_buffer.pu1_bufs[1],
                        ps_dec_ip->s_out_buffer.pu1_bufs[2], ps_codec->i4_disp_strd,
                        xpos,
                        ypos,
                        ps_codec->e_chroma_fmt,
                        ps_codec->i4_disp_wd,
                        ps_codec->i4_disp_ht);
        }


        if(NULL == ps_codec->ps_disp_buf)
        {
            /* If in flush mode and there are no more buffers to flush,
             * check for the reset flag and reset the decoder */
            if(ps_codec->i4_reset_flag)
            {
                ihevcd_init(ps_codec);
            }
            return (IV_FAIL);
        }

        return (IV_SUCCESS);

    }
    /* In case of shared mode, check if there is a free buffer for reconstruction */
    if((0 == ps_codec->i4_header_mode) && (1 == ps_codec->i4_share_disp_buf))
    {
        WORD32 buf_status;
        buf_status = 1;
        if(ps_codec->pv_pic_buf_mgr)
            buf_status = ihevc_buf_mgr_check_free((buf_mgr_t *)ps_codec->pv_pic_buf_mgr);

        /* If there is no free buffer, then return with an error code */
        if(0 == buf_status)
        {
            ps_dec_op->u4_error_code = IVD_DEC_REF_BUF_NULL;
            ps_dec_op->u4_error_code |= (1 << IVD_UNSUPPORTEDPARAM);
            return IV_FAIL;
        }
    }
    ps_codec->i4_bytes_remaining = ps_dec_ip->u4_num_Bytes;
    ps_codec->pu1_inp_bitsbuf = (UWORD8 *)ps_dec_ip->pv_stream_buffer;
    ps_codec->s_parse.i4_end_of_frame = 0;

    ps_codec->i4_pic_present = 0;
    ps_codec->i4_slice_error = 0;
    ps_codec->ps_disp_buf = NULL;

    if(ps_codec->i4_num_cores > 1)
    {
        ithread_set_affinity(0);
    }
    while(MIN_START_CODE_LEN < ps_codec->i4_bytes_remaining)
    {
        WORD32 nal_len;
        WORD32 nal_ofst;
        WORD32 bits_len;

        if(ps_codec->i4_slice_error)
        {
            slice_header_t *ps_slice_hdr_next = ps_codec->s_parse.ps_slice_hdr_base + (ps_codec->s_parse.i4_cur_slice_idx & (MAX_SLICE_HDR_CNT - 1));
            WORD32 next_slice_addr = ps_slice_hdr_next->i2_ctb_x +
                            ps_slice_hdr_next->i2_ctb_y * ps_codec->s_parse.ps_sps->i2_pic_wd_in_ctb;
            if(ps_codec->s_parse.i4_next_ctb_indx == next_slice_addr)
                ps_codec->i4_slice_error = 0;
        }

        if(ps_codec->pu1_bitsbuf_dynamic)
        {
            ps_codec->pu1_bitsbuf = ps_codec->pu1_bitsbuf_dynamic;
            ps_codec->u4_bitsbuf_size = ps_codec->u4_bitsbuf_size_dynamic;
        }
        else
        {
            ps_codec->pu1_bitsbuf = ps_codec->pu1_bitsbuf_static;
            ps_codec->u4_bitsbuf_size = ps_codec->u4_bitsbuf_size_static;
        }

        nal_ofst = ihevcd_nal_search_start_code(ps_codec->pu1_inp_bitsbuf,
                                                ps_codec->i4_bytes_remaining);

        ps_codec->i4_nal_ofst = nal_ofst;
        {
            WORD32 bytes_remaining = ps_codec->i4_bytes_remaining - nal_ofst;

            bytes_remaining = MIN((UWORD32)bytes_remaining, ps_codec->u4_bitsbuf_size);
            ihevcd_nal_remv_emuln_bytes(ps_codec->pu1_inp_bitsbuf + nal_ofst,
                                        ps_codec->pu1_bitsbuf,
                                        bytes_remaining,
                                        &nal_len, &bits_len);

            /* Decoder may read upto 8 extra bytes at the end of frame */
            /* These are not used, but still set them to zero to avoid uninitialized reads */
            if(bits_len < (WORD32)(ps_codec->u4_bitsbuf_size - 8))
            {
                memset(ps_codec->pu1_bitsbuf + bits_len, 0, 2 * sizeof(UWORD32));
            }
        }
        /* This may be used to update the offsets for tiles and entropy sync row offsets */
        ps_codec->i4_num_emln_bytes = nal_len - bits_len;
        ps_codec->i4_nal_len = nal_len;

        ihevcd_bits_init(&ps_codec->s_parse.s_bitstrm, ps_codec->pu1_bitsbuf,
                         bits_len);

        ret = ihevcd_nal_unit(ps_codec);

        /* If the frame is incomplete and
         * the bytes remaining is zero or a header is received,
         * complete the frame treating it to be in error */
        if(ps_codec->i4_pic_present &&
                        (ps_codec->s_parse.i4_next_ctb_indx != ps_codec->s_parse.ps_sps->i4_pic_size_in_ctb))
        {
            if((ps_codec->i4_bytes_remaining - (nal_len + nal_ofst) <= MIN_START_CODE_LEN) ||
                            (ps_codec->i4_header_in_slice_mode))
            {
                slice_header_t *ps_slice_hdr_next;

                ps_codec->s_parse.i4_cur_slice_idx--;
                if(ps_codec->s_parse.i4_cur_slice_idx < 0)
                    ps_codec->s_parse.i4_cur_slice_idx = 0;

                ps_slice_hdr_next = ps_codec->s_parse.ps_slice_hdr_base + ((ps_codec->s_parse.i4_cur_slice_idx + 1) & (MAX_SLICE_HDR_CNT - 1));
                ps_slice_hdr_next->i2_ctb_x = 0;
                ps_slice_hdr_next->i2_ctb_y = ps_codec->s_parse.ps_sps->i2_pic_ht_in_ctb;
                ps_codec->i4_slice_error = 1;
                continue;
            }
        }

        if(IHEVCD_IGNORE_SLICE == ret)
        {
            ps_codec->s_parse.i4_cur_slice_idx = MAX(0, (ps_codec->s_parse.i4_cur_slice_idx - 1));
            ps_codec->pu1_inp_bitsbuf += (nal_ofst + nal_len);
            ps_codec->i4_bytes_remaining -= (nal_ofst + nal_len);

            continue;
        }

        if((IVD_RES_CHANGED == ret) ||
           (IVD_STREAM_WIDTH_HEIGHT_NOT_SUPPORTED == ret))
        {
            break;
        }

        /* Update bytes remaining and bytes consumed and input bitstream pointer */
        /* Do not consume the NAL in the following cases */
        /* Slice header reached during header decode mode */
        /* TODO: Next picture's slice reached */
        if(ret != IHEVCD_SLICE_IN_HEADER_MODE)
        {
            if((0 == ps_codec->i4_slice_error) ||
                            (ps_codec->i4_bytes_remaining - (nal_len + nal_ofst) <= MIN_START_CODE_LEN))
            {
                ps_codec->pu1_inp_bitsbuf += (nal_ofst + nal_len);
                ps_codec->i4_bytes_remaining -= (nal_ofst + nal_len);
            }
            if(ret != IHEVCD_SUCCESS)
                break;

            if(ps_codec->s_parse.i4_end_of_frame)
                break;
        }
        else
        {
            ret = IHEVCD_SUCCESS;
            break;
        }

        /* Allocate dynamic bitstream buffer once SPS is decoded */
        if((ps_codec->u4_allocate_dynamic_done == 0) && ps_codec->i4_sps_done)
        {
            WORD32 ret;
            ret = ihevcd_allocate_dynamic_bufs(ps_codec);
            if(ret != IV_SUCCESS)
            {
                /* Free any dynamic buffers that are allocated */
                ihevcd_free_dynamic_bufs(ps_codec);
                ps_codec->i4_error_code = IVD_MEM_ALLOC_FAILED;
                ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
                ps_dec_op->u4_error_code |= IVD_MEM_ALLOC_FAILED;

                return IV_FAIL;
            }
        }

        BREAK_AFTER_SLICE_NAL();
    }

    if((ps_codec->u4_pic_cnt == 0) && (ret != IHEVCD_SUCCESS))
    {
        ps_codec->i4_error_code = ret;

        ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);
        return IV_FAIL;
    }

    if(1 == ps_codec->i4_pic_present)
    {
        WORD32 i;
        sps_t *ps_sps = ps_codec->s_parse.ps_sps;
        ps_codec->i4_first_pic_done = 1;

        /*TODO temporary fix: end_of_frame is checked before adding format conversion to job queue         */
        if(ps_codec->i4_num_cores > 1 && ps_codec->s_parse.i4_end_of_frame)
        {

            /* Add job queue for format conversion / frame copy for each ctb row */
            /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
            process_ctxt_t *ps_proc;

            /* i4_num_cores - 1 contexts are currently being used by other threads */
            ps_proc = &ps_codec->as_process[ps_codec->i4_num_cores - 1];

            if((ps_codec->ps_disp_buf) &&
               ((0 == ps_codec->i4_share_disp_buf) || (IV_YUV_420P == ps_codec->e_chroma_fmt)))
            {
                /* If format conversion jobs were not issued in pic_init() add them here */
                if((0 == ps_codec->u4_enable_fmt_conv_ahead) ||
                                (ps_codec->i4_disp_buf_id == ps_proc->i4_cur_pic_buf_id))
                    for(i = 0; i < ps_sps->i2_pic_ht_in_ctb; i++)
                    {
                        proc_job_t s_job;
                        IHEVCD_ERROR_T ret;
                        s_job.i4_cmd = CMD_FMTCONV;
                        s_job.i2_ctb_cnt = 0;
                        s_job.i2_ctb_x = 0;
                        s_job.i2_ctb_y = i;
                        s_job.i2_slice_idx = 0;
                        s_job.i4_tu_coeff_data_ofst = 0;
                        ret = ihevcd_jobq_queue((jobq_t *)ps_codec->s_parse.pv_proc_jobq,
                                                &s_job, sizeof(proc_job_t), 1);
                        if(ret != (IHEVCD_ERROR_T)IHEVCD_SUCCESS)
                            return (WORD32)ret;
                    }
            }
            /* Reached end of frame : Signal terminate */
            /* The terminate flag is checked only after all the jobs are dequeued */
            ret = ihevcd_jobq_terminate((jobq_t *)ps_codec->s_parse.pv_proc_jobq);

            while(1)
            {
                IHEVCD_ERROR_T ret;
                proc_job_t s_job;
                process_ctxt_t *ps_proc;

                /* i4_num_cores - 1 contexts are currently being used by other threads */
                ps_proc = &ps_codec->as_process[ps_codec->i4_num_cores - 1];

                ret = ihevcd_jobq_dequeue((jobq_t *)ps_proc->pv_proc_jobq, &s_job,
                                          sizeof(proc_job_t), 1);
                if((IHEVCD_ERROR_T)IHEVCD_SUCCESS != ret)
                    break;

                ps_proc->i4_ctb_cnt = s_job.i2_ctb_cnt;
                ps_proc->i4_ctb_x = s_job.i2_ctb_x;
                ps_proc->i4_ctb_y = s_job.i2_ctb_y;
                ps_proc->i4_cur_slice_idx = s_job.i2_slice_idx;

                if(CMD_PROCESS == s_job.i4_cmd)
                {
                    ihevcd_init_proc_ctxt(ps_proc, s_job.i4_tu_coeff_data_ofst);

                    ihevcd_process(ps_proc);
                }
                else if(CMD_FMTCONV == s_job.i4_cmd)
                {
                    sps_t *ps_sps = ps_codec->s_parse.ps_sps;
                    WORD32 num_rows = 1 << ps_sps->i1_log2_ctb_size;
                    if(0 == ps_proc->i4_init_done)
                    {
                        ihevcd_init_proc_ctxt(ps_proc, 0);
                    }

                    num_rows = MIN(num_rows, (ps_codec->i4_disp_ht - (s_job.i2_ctb_y << ps_sps->i1_log2_ctb_size)));
                    if(num_rows < 0)
                        num_rows = 0;

                    ihevcd_fmt_conv(ps_codec, ps_proc,
                                    ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                    ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                    ps_dec_ip->s_out_buffer.pu1_bufs[2],
                                    s_job.i2_ctb_y << ps_sps->i1_log2_ctb_size,
                                    num_rows);
                }
            }
        }
        /* In case of non-shared mode and while running in single core mode, then convert/copy the frame to output buffer */
        /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
        else if((ps_codec->ps_disp_buf) && ((0 == ps_codec->i4_share_disp_buf) ||
                                            (IV_YUV_420P == ps_codec->e_chroma_fmt)) &&
                        (ps_codec->s_parse.i4_end_of_frame))
        {
            process_ctxt_t *ps_proc = &ps_codec->as_process[proc_idx];
            /* Set remaining number of rows to be processed */
            ps_codec->s_fmt_conv.i4_num_rows = ps_codec->i4_disp_ht
                            - ps_codec->s_fmt_conv.i4_cur_row;
            if(0 == ps_proc->i4_init_done)
            {
                ihevcd_init_proc_ctxt(ps_proc, 0);
            }

            if(ps_codec->s_fmt_conv.i4_num_rows < 0)
                ps_codec->s_fmt_conv.i4_num_rows = 0;

            ret = ihevcd_fmt_conv(ps_codec, ps_proc,
                                  ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[2],
                                  ps_codec->s_fmt_conv.i4_cur_row,
                                  ps_codec->s_fmt_conv.i4_num_rows);
            ps_codec->s_fmt_conv.i4_cur_row += ps_codec->s_fmt_conv.i4_num_rows;

        }


        DEBUG_DUMP_MV_MAP(ps_codec);

        /* Mark MV Buf as needed for reference */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_mv_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_mv_bank_buf_id,
                                 BUF_MGR_REF);

        /* Mark pic buf as needed for reference */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id,
                                 BUF_MGR_REF);

        /* Mark pic buf as needed for display */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id,
                                 BUF_MGR_DISP);

        /* Insert the current picture as short term reference */
        ihevc_dpb_mgr_insert_ref((dpb_mgr_t *)ps_codec->pv_dpb_mgr,
                                 ps_codec->as_process[proc_idx].ps_cur_pic,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id);

        /* If a frame was displayed (in non-shared mode), then release it from display manager */
        if((0 == ps_codec->i4_share_disp_buf) && (ps_codec->ps_disp_buf))
            ihevc_buf_mgr_release((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                  ps_codec->i4_disp_buf_id, BUF_MGR_DISP);

        /* Wait for threads */
        for(i = 0; i < (ps_codec->i4_num_cores - 1); i++)
        {
            if(ps_codec->ai4_process_thread_created[i])
            {
                ithread_join(ps_codec->apv_process_thread_handle[i], NULL);
                ps_codec->ai4_process_thread_created[i] = 0;
            }
        }

        DEBUG_VALIDATE_PADDED_REGION(&ps_codec->as_process[proc_idx]);
        if(ps_codec->u4_pic_cnt > 0)
        {
            DEBUG_DUMP_PIC_PU(ps_codec);
        }
        DEBUG_DUMP_PIC_BUFFERS(ps_codec);

        /* Increment the number of pictures decoded */
        ps_codec->u4_pic_cnt++;
    }
    ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);

    if(1 == ps_dec_op->u4_output_present)
    {
        WORD32 xpos = ps_codec->i4_disp_wd - 32 - LOGO_WD;
        WORD32 ypos = ps_codec->i4_disp_ht - 32 - LOGO_HT;

        if(ypos < 0)
            ypos = 0;

        if(xpos < 0)
            xpos = 0;

        INSERT_LOGO(ps_dec_ip->s_out_buffer.pu1_bufs[0],
                    ps_dec_ip->s_out_buffer.pu1_bufs[1],
                    ps_dec_ip->s_out_buffer.pu1_bufs[2], ps_codec->i4_disp_strd,
                    xpos,
                    ypos,
                    ps_codec->e_chroma_fmt,
                    ps_codec->i4_disp_wd,
                    ps_codec->i4_disp_ht);
    }


    return ret;
}